

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5InterrogatorBasicData *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KStringStream ss;
  KString local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  KString local_208;
  KString local_1e8;
  KString local_1c8;
  ulong local_1a8;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Mode 5 Interrogator Basic Data:",0x1f);
  Mode5InterrogatorStatus::GetAsString_abi_cxx11_(&local_1c8,&this->m_Status);
  UTILS::IndentString(&local_208,&local_1c8,Tabs,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_208._M_dataplus._M_p,local_208._M_string_length);
  local_1a8 = (ulong)this->m_ui32MsgFormats;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_228,(bitset<32ul> *)&local_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_228._M_dataplus._M_p,local_228._M_string_length);
  EntityIdentifier::GetAsString_abi_cxx11_(&local_1e8,&this->m_InterrogatedID);
  UTILS::IndentString(&local_248,&local_1e8,Tabs_00,in_CL);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_248._M_dataplus._M_p,local_248._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5InterrogatorBasicData::GetAsString() const
{
    KStringStream ss;	
	ss << "Mode 5 Interrogator Basic Data:"
       << IndentString( m_Status.GetAsString() )
	   << GetMessageFormatsPresentBitSet().to_string()
	   << IndentString( m_InterrogatedID.GetAsString() );	   
	   
    return ss.str();
}